

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O2

char * KINGetLinReturnFlagName(long flag)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  pcVar1 = (char *)malloc(0x1e);
  switch(flag) {
  case 0:
    builtin_strncpy(pcVar1 + 6,"SUCCESS",8);
    uVar2 = 0x55535f534c4e494b;
    goto LAB_001104ee;
  default:
    builtin_strncpy(pcVar1,"NONE",5);
    break;
  case -8:
    builtin_strncpy(pcVar1,"KINLS_SUNLS_FAIL",0x11);
    break;
  case -7:
    builtin_strncpy(pcVar1,"KINLS_SUNMAT_FAIL",0x12);
    break;
  case -6:
    builtin_strncpy(pcVar1,"KINLS_JACFUNC_ERR",0x12);
    break;
  case -5:
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = '_';
    uVar3._2_1_ = 'P';
    uVar3._3_1_ = 'M';
    uVar4._0_1_ = 'E';
    uVar4._1_1_ = 'M';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'N';
    uVar5._0_1_ = 'U';
    uVar5._1_1_ = 'L';
    uVar5._2_1_ = 'L';
    uVar5._3_1_ = '\0';
    goto LAB_001104d1;
  case -4:
    uVar2 = 0x4c4941465f4d45;
    goto LAB_0011049f;
  case -3:
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = '_';
    uVar3._2_1_ = 'I';
    uVar3._3_1_ = 'L';
    uVar4._0_1_ = 'L';
    uVar4._1_1_ = '_';
    uVar4._2_1_ = 'I';
    uVar4._3_1_ = 'N';
    uVar5._0_1_ = 'P';
    uVar5._1_1_ = 'U';
    uVar5._2_1_ = 'T';
    uVar5._3_1_ = '\0';
    goto LAB_001104d1;
  case -2:
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = '_';
    uVar3._2_1_ = 'L';
    uVar3._3_1_ = 'M';
    uVar4._0_1_ = 'E';
    uVar4._1_1_ = 'M';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'N';
    uVar5._0_1_ = 'U';
    uVar5._1_1_ = 'L';
    uVar5._2_1_ = 'L';
    uVar5._3_1_ = '\0';
LAB_001104d1:
    pcVar1[0] = 'K';
    pcVar1[1] = 'I';
    pcVar1[2] = 'N';
    pcVar1[3] = 'L';
    *(undefined4 *)(pcVar1 + 4) = uVar3;
    *(undefined4 *)(pcVar1 + 8) = uVar4;
    *(undefined4 *)(pcVar1 + 0xc) = uVar5;
    break;
  case -1:
    uVar2 = 0x4c4c554e5f4d45;
LAB_0011049f:
    *(undefined8 *)(pcVar1 + 7) = uVar2;
    uVar2 = 0x454d5f534c4e494b;
LAB_001104ee:
    *(undefined8 *)pcVar1 = uVar2;
  }
  return pcVar1;
}

Assistant:

char* KINGetLinReturnFlagName(long int flag)
{
  char* name;

  name = (char*)malloc(30 * sizeof(char));

  switch (flag)
  {
  case KINLS_SUCCESS: sprintf(name, "KINLS_SUCCESS"); break;
  case KINLS_MEM_NULL: sprintf(name, "KINLS_MEM_NULL"); break;
  case KINLS_LMEM_NULL: sprintf(name, "KINLS_LMEM_NULL"); break;
  case KINLS_ILL_INPUT: sprintf(name, "KINLS_ILL_INPUT"); break;
  case KINLS_MEM_FAIL: sprintf(name, "KINLS_MEM_FAIL"); break;
  case KINLS_PMEM_NULL: sprintf(name, "KINLS_PMEM_NULL"); break;
  case KINLS_JACFUNC_ERR: sprintf(name, "KINLS_JACFUNC_ERR"); break;
  case KINLS_SUNMAT_FAIL: sprintf(name, "KINLS_SUNMAT_FAIL"); break;
  case KINLS_SUNLS_FAIL: sprintf(name, "KINLS_SUNLS_FAIL"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}